

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::SampleBuffersTestCase::test(SampleBuffersTestCase *this)

{
  int iVar1;
  RenderTarget *pRVar2;
  MessageBuilder *pMVar3;
  int local_1a8 [4];
  MessageBuilder local_198;
  uint local_14;
  SampleBuffersTestCase *pSStack_10;
  int expectedSampleBuffers;
  SampleBuffersTestCase *this_local;
  
  pSStack_10 = this;
  pRVar2 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(pRVar2);
  local_14 = (uint)(1 < iVar1);
  tcu::TestLog::operator<<
            (&local_198,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [17])"Sample count is ");
  pRVar2 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  local_1a8[0] = tcu::RenderTarget::getNumSamples(pRVar2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1a8);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [37])", expecting GL_SAMPLE_BUFFERS to be ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&local_14);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80a8,
             (ulong)local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		const int expectedSampleBuffers = (m_context.getRenderTarget().getNumSamples() > 1) ? 1 : 0;

		m_log << tcu::TestLog::Message << "Sample count is " << (m_context.getRenderTarget().getNumSamples()) << ", expecting GL_SAMPLE_BUFFERS to be " << expectedSampleBuffers << tcu::TestLog::EndMessage;

		m_verifier->verifyInteger(m_testCtx, GL_SAMPLE_BUFFERS, expectedSampleBuffers);
		expectError(GL_NO_ERROR);
	}